

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_61;
  string local_60;
  TPZGeoTetrahedra local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"TPZMultiphysicsCompEl",&local_61);
  uVar1 = Hash(&local_60);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)this);
  pzgeom::TPZGeoTetrahedra::TPZGeoTetrahedra(&local_40);
  iVar3 = pzgeom::TPZGeoTetrahedra::ClassId(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}